

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O2

void __thiscall ser::OffsetTable::Cleanup(OffsetTable *this)

{
  std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::clear(&this->savepoints_);
  std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
  ::clear(&this->entries_);
  std::
  _Rb_tree<ser::Savepoint,_std::pair<const_ser::Savepoint,_int>,_std::_Select1st<std::pair<const_ser::Savepoint,_int>_>,_std::less<ser::Savepoint>,_std::allocator<std::pair<const_ser::Savepoint,_int>_>_>
  ::clear(&(this->savepointIndex_)._M_t);
  return;
}

Assistant:

void OffsetTable::Cleanup()
{
    savepoints_.clear();
    entries_.clear();
    savepointIndex_.clear();
}